

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O3

void __thiscall xercesc_4_0::AbstractDOMParser::parse(AbstractDOMParser *this,InputSource *source)

{
  DOMDocumentImpl *pDVar1;
  IOException *this_00;
  ResetInProgressType resetInProgress;
  JanitorMemFunCall<xercesc_4_0::AbstractDOMParser> local_28;
  
  if (this->fParseInProgress != true) {
    local_28.fToCall = (MFPT)AbstractDOMParser::resetInProgress;
    local_28._16_8_ = 0;
    this->fParseInProgress = true;
    local_28.fObject = this;
    (*(this->fScanner->super_XMLBufferFullHandler)._vptr_XMLBufferFullHandler[7])();
    if (((this->fDoXInclude == true) && (this->fScanner->fErrorCount == 0)) &&
       (pDVar1 = this->fDocument, pDVar1 != (DOMDocumentImpl *)0x0)) {
      (*(pDVar1->super_DOMDocument).super_DOMDocumentRange._vptr_DOMDocumentRange[0x20])
                (&pDVar1->super_DOMDocument);
    }
    JanitorMemFunCall<xercesc_4_0::AbstractDOMParser>::~JanitorMemFunCall(&local_28);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x30);
  IOException::IOException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/parsers/AbstractDOMParser.cpp"
             ,0x224,Gen_ParseInProgress,this->fMemoryManager);
  __cxa_throw(this_00,&IOException::typeinfo,XMLException::~XMLException);
}

Assistant:

void AbstractDOMParser::parse(const InputSource& source)
{
    // Avoid multiple entrance
    if (fParseInProgress)
        ThrowXMLwithMemMgr(IOException, XMLExcepts::Gen_ParseInProgress, fMemoryManager);

    ResetInProgressType     resetInProgress(this, &AbstractDOMParser::resetInProgress);

    try
    {
        fParseInProgress = true;
        fScanner->scanDocument(source);

        if (fDoXInclude && getErrorCount()==0){
		    DOMDocument *doc = getDocument();
            // after XInclude, the document must be normalized
            if(doc)
            	doc->normalizeDocument();
        }
    }
    catch(const OutOfMemoryException&)
    {
        resetInProgress.release();

        throw;
    }
}